

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

BinaryExpr<const_short_&,_const_int_&> * __thiscall
Catch::ExprLhs<short_const&>::operator==
          (BinaryExpr<const_short_&,_const_int_&> *__return_storage_ptr__,
          ExprLhs<short_const&> *this,int *rhs)

{
  short sVar1;
  int iVar2;
  short *psVar3;
  StringRef local_40;
  
  psVar3 = *(short **)this;
  sVar1 = *psVar3;
  iVar2 = *rhs;
  Catch::StringRef::StringRef(&local_40,"==");
  __return_storage_ptr__->field_0x8 = 1;
  __return_storage_ptr__->field_0x9 = iVar2 == sVar1;
  *(undefined ***)__return_storage_ptr__ = &PTR_streamReconstructedExpression_00107d10;
  __return_storage_ptr__->m_lhs = psVar3;
  (__return_storage_ptr__->m_op).m_start = local_40.m_start;
  (__return_storage_ptr__->m_op).m_size = local_40.m_size;
  __return_storage_ptr__->m_rhs = rhs;
  return __return_storage_ptr__;
}

Assistant:

auto operator == ( RhsT const& rhs ) -> BinaryExpr<LhsT, RhsT const&> const {
            return { compareEqual( m_lhs, rhs ), m_lhs, "==", rhs };
        }